

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wizard.c
# Opt level: O0

void intervene(void)

{
  boolean bVar1;
  char *pcVar2;
  int local_10;
  int which;
  
  bVar1 = on_level(&u.uz,&dungeon_topology.d_astral_level);
  if (bVar1 == '\0') {
    local_10 = rn2(6);
  }
  else {
    local_10 = rnd(4);
  }
  switch(local_10) {
  case 0:
  case 1:
    pline("You feel vaguely nervous.");
    break;
  case 2:
    if (((u.uprops[0x1e].intrinsic == 0) &&
        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
      pcVar2 = hcolor("black");
      pline("You notice a %s glow surrounding you.",pcVar2);
    }
    rndcurse();
    break;
  case 3:
    aggravate();
    break;
  case 4:
    nasty((monst *)0x0);
    break;
  case 5:
    resurrect();
  }
  return;
}

Assistant:

void intervene(void)
{
	int which = Is_astralevel(&u.uz) ? rnd(4) : rn2(6);
	/* cases 0 and 5 don't apply on the Astral level */
	switch (which) {
	    case 0:
	    case 1:	pline("You feel vaguely nervous.");
			break;
	    case 2:	if (!Blind)
			    pline("You notice a %s glow surrounding you.",
				  hcolor("black"));
			rndcurse();
			break;
	    case 3:	aggravate();
			break;
	    case 4:	nasty(NULL);
			break;
	    case 5:	resurrect();
			break;
	}
}